

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode Curl_url_set_authority(CURLU *u,char *authority)

{
  CURLUcode CVar1;
  size_t authlen;
  char *pcVar2;
  dynbuf host;
  dynbuf local_40;
  
  Curl_dyn_init(&local_40,8000000);
  authlen = strlen(authority);
  CVar1 = parse_authority(u,authority,authlen,0x20,&local_40,u->scheme != (char *)0x0);
  if (CVar1 == CURLUE_OK) {
    (*Curl_cfree)(u->host);
    pcVar2 = Curl_dyn_ptr(&local_40);
    u->host = pcVar2;
  }
  else {
    Curl_dyn_free(&local_40);
  }
  return CVar1;
}

Assistant:

CURLUcode Curl_url_set_authority(CURLU *u, const char *authority)
{
  CURLUcode result;
  struct dynbuf host;

  DEBUGASSERT(authority);
  Curl_dyn_init(&host, CURL_MAX_INPUT_LENGTH);

  result = parse_authority(u, authority, strlen(authority),
                           CURLU_DISALLOW_USER, &host, !!u->scheme);
  if(result)
    Curl_dyn_free(&host);
  else {
    free(u->host);
    u->host = Curl_dyn_ptr(&host);
  }
  return result;
}